

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O1

char * nni_inet_ntop(uint8_t *addr,char *buf)

{
  ulong uVar1;
  size_t sVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  
  if (*(int *)(addr + 8) == -0x10000 && *(long *)addr == 0) {
    snprintf(buf,0x2e,"::ffff:%u.%u.%u.%u",(ulong)addr[0xc],(ulong)addr[0xd],(ulong)addr[0xe],
             (uint)addr[0xf]);
  }
  else {
    bVar5 = 0;
    uVar1 = 0;
    bVar3 = 0;
    uVar7 = 0;
    uVar4 = 0;
    do {
      if ((addr[uVar4] == '\0') && (addr[uVar4 + 1] == '\0')) {
        bVar3 = bVar3 + 2;
        uVar7 = uVar7 & 0xff;
        if (bVar3 == 2) {
          uVar7 = uVar4 & 0xffffffff;
        }
        uVar1 = uVar1 & 0xff;
        if (bVar5 < bVar3) {
          uVar1 = uVar7;
          bVar5 = bVar3;
        }
      }
      else {
        bVar3 = 0;
      }
      bVar9 = uVar4 < 0xe;
      uVar4 = uVar4 + 2;
    } while (bVar9);
    bVar3 = 0xff;
    if (1 < bVar5) {
      bVar3 = (byte)uVar1;
    }
    *buf = '\0';
    bVar9 = false;
    iVar6 = 0;
    uVar1 = 0;
    do {
      if (bVar3 == uVar1) {
        if (0x2b < iVar6) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                    ,0x55,"idx <= 43");
        }
        pcVar8 = buf + iVar6;
        sVar2 = strlen(pcVar8);
        (pcVar8 + sVar2)[0] = ':';
        (pcVar8 + sVar2)[1] = ':';
        pcVar8[sVar2 + 2] = '\0';
        iVar6 = iVar6 + 2;
        bVar9 = false;
      }
      else if ((uVar1 < bVar3) || ((uint)bVar5 + (uint)bVar3 <= (uint)uVar1)) {
        if (0x28 < iVar6) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                    ,0x5c,"idx <= 40");
        }
        pcVar8 = "%x";
        if (bVar9) {
          pcVar8 = ":%x";
        }
        snprintf(buf + iVar6,6,pcVar8,
                 (ulong)(ushort)(*(ushort *)(addr + uVar1) << 8 | *(ushort *)(addr + uVar1) >> 8));
        sVar2 = strlen(buf + iVar6);
        iVar6 = (int)sVar2 + iVar6;
        bVar9 = true;
      }
      bVar10 = uVar1 < 0xe;
      uVar1 = uVar1 + 2;
    } while (bVar10);
  }
  return buf;
}

Assistant:

static char *
nni_inet_ntop(const uint8_t addr[16], char buf[46])
{

	const uint8_t v4map[12] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0xff };

	if (memcmp(addr, v4map, 12) == 0) {
		snprintf(buf, 46, "::ffff:%u.%u.%u.%u", addr[12], addr[13],
		    addr[14], addr[15]);
		return (buf);
	}

	uint8_t off    = 0; // offset of first set of elided zeros
	uint8_t cnt    = 0; // how many elided zeros so far
	uint8_t maxoff = 0; // offset of largest compressed region
	uint8_t maxcnt = 0; // how many elided zeros at maxoff

	// look for the largest compressible region
	for (uint8_t i = 0; i < 16; i += 2) {
		// is this word zero?
		if ((addr[i] == 0) && (addr[i + 1] == 0)) {
			cnt += 2;
			// if this was the first zero word in region, record it
			if (cnt == 2) {
				off = i;
			}
			// possibly update the maximums
			if (cnt > maxcnt) {
				maxcnt = cnt;
				maxoff = off;
			}
		} else {
			cnt = 0;
		}
	}
	if (maxcnt < 2) {
		maxoff = 0xff; // too big for anything
	}

	int  idx = 0;
	bool sep = false;
	buf[0]   = 0;
	for (uint8_t i = 0; i < 16; i += 2) {
		// We have 46 bytes allocated, which is a "theoretical"
		// maximum only.  In practice the worst case is really
		// 8 groups of four digits with 7 colons, so 39 bytes plus
		// the null is 40 bytes.  We only use the v4 mapped syntax
		// when presented with ::ffff: - so 23 bytes for that syntax.
		if (i == maxoff) {
			NNI_ASSERT(idx <= 43);
			strcat(buf + idx, "::");
			idx += 2;
			sep = false;
		} else if (i < maxoff || i >= maxoff + maxcnt) {
			// this takes at most six bytes -- four hax digits a
			// colon, and a null
			NNI_ASSERT(idx <= 40);
			snprintf(buf + idx, 6, sep ? ":%x" : "%x",
			    (((uint16_t) addr[i]) << 8) + addr[i + 1]);
			idx += strlen(buf + idx);
			sep = true;
		}
	}
	return (buf);
}